

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O3

void __thiscall
World_3df::save_elite(World_3df *this,shared_ptr<Population> *src,shared_ptr<Population> *dst)

{
  element_type *peVar1;
  Creature *this_00;
  element_type *peVar2;
  shared_ptr<Population> *psVar3;
  undefined1 auVar4 [8];
  double dVar5;
  double *pdVar6;
  creatfitdict_t *__x;
  creat_t *__x_00;
  element_type *peVar7;
  double *pdVar8;
  char *pcVar9;
  undefined1 auVar10 [8];
  long lVar11;
  pointer __src;
  ulong uVar12;
  long val;
  double dVar13;
  Msg local_268;
  Msg local_238;
  Msg local_208;
  Msg local_1d8;
  Msg local_1a8;
  Msg local_178;
  Msg local_148;
  Msg local_118;
  string local_e8;
  string local_c8;
  string local_a8;
  element_type *local_88;
  shared_count local_80;
  shared_ptr<Population> *local_78;
  shared_ptr<Population> *local_70;
  undefined1 local_68 [8];
  creatfitdict_t tmp;
  creat_t tmps;
  
  local_70 = dst;
  if (src->px != (Population *)0x0) {
    __x = Population::get_creatures_fdict(src->px);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_68,__x);
    if (src->px != (Population *)0x0) {
      __x_00 = Population::get_creatures(src->px);
      std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
      vector((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *)
             &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__x_00);
      peVar1 = (this->super_World).LOGFILE.px;
      local_118.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
      if ((sp_counted_base *)local_118.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)local_118.msg_txt._M_dataplus._M_p)->use_count_ =
             ((sp_counted_base *)local_118.msg_txt._M_dataplus._M_p)->use_count_ + 1;
        UNLOCK();
      }
      local_118._vptr_Msg = (_func_int **)peVar1;
      if (peVar1 == (element_type *)0x0) {
LAB_00111cf9:
        pcVar9 = 
        "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<util::logging::File_logger>::operator*() const [T = util::logging::File_logger]"
        ;
LAB_00111d44:
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,pcVar9);
      }
      util::logging::Msg::Msg(&local_148,anon_var_dwarf_37028,L_NORM);
      (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_148);
      util::logging::Msg::~Msg(&local_148);
      boost::detail::shared_count::~shared_count((shared_count *)&local_118.msg_txt);
      peVar7 = src->px;
      if (peVar7 != (element_type *)0x0) {
        uVar12 = 0;
        local_78 = src;
        do {
          auVar4 = local_68;
          if (peVar7->ELITE_SIZE <= uVar12) {
            peVar1 = (this->super_World).LOGFILE.px;
            local_118.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
            if ((sp_counted_base *)local_118.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
              LOCK();
              ((sp_counted_base *)local_118.msg_txt._M_dataplus._M_p)->use_count_ =
                   ((sp_counted_base *)local_118.msg_txt._M_dataplus._M_p)->use_count_ + 1;
              UNLOCK();
            }
            local_118._vptr_Msg = (_func_int **)peVar1;
            if (peVar1 != (element_type *)0x0) {
              util::logging::Msg::Msg(&local_148,anon_var_dwarf_3703e,L_NORM);
              (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_148);
              util::logging::Msg::~Msg(&local_148);
              boost::detail::shared_count::~shared_count((shared_count *)&local_118.msg_txt);
              std::
              vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
              ~vector((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                       *)&tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              if (local_68 != (undefined1  [8])0x0) {
                operator_delete((void *)local_68);
              }
              return;
            }
            goto LAB_00111cf9;
          }
          pdVar8 = (double *)((long)local_68 + 8);
          auVar10 = local_68;
          if (pdVar8 != tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start &&
              local_68 !=
              (undefined1  [8])
              tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            dVar13 = *(double *)local_68;
            do {
              dVar5 = *pdVar8;
              pdVar6 = pdVar8;
              if (*pdVar8 <= dVar13) {
                dVar5 = dVar13;
                pdVar6 = (double *)auVar10;
              }
              auVar10 = (undefined1  [8])pdVar6;
              dVar13 = dVar5;
              pdVar8 = pdVar8 + 1;
            } while (pdVar8 != tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          peVar1 = (this->super_World).LOGFILE.px;
          local_80.pi_ = (this->super_World).LOGFILE.pn.pi_;
          if (local_80.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_80.pi_)->use_count_ = (local_80.pi_)->use_count_ + 1;
            UNLOCK();
          }
          local_88 = peVar1;
          if (peVar1 == (element_type *)0x0) goto LAB_00111cf9;
          util::logging::Msg::Msg(&local_178,"...Zachowano stwora z pozycji [",L_NORM);
          lVar11 = (long)auVar10 - (long)auVar4;
          val = lVar11 >> 3;
          util::logging::Msg::operator+(&local_1a8,&local_178,val);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"]: x1 = ","");
          util::logging::Msg::operator+(&local_1d8,&local_1a8,&local_e8);
          if ((Creature *)
              tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[val * 2] == (Creature *)0x0) {
LAB_00111ce2:
            pcVar9 = 
            "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
            ;
            goto LAB_00111d25;
          }
          dVar13 = Creature::get_phenotype
                             ((Creature *)
                              tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[val * 2],0,0,0);
          util::logging::Msg::operator+(&local_208,&local_1d8,dVar13);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"; x2 = ","");
          util::logging::Msg::operator+(&local_238,&local_208,&local_c8);
          this_00 = (Creature *)
                    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[val * 2];
          if (this_00 == (Creature *)0x0) goto LAB_00111ce2;
          peVar2 = ((this_00->chroms).
                    super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->px;
          if (peVar2 == (element_type *)0x0) {
            pcVar9 = 
            "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Chromosome>::operator->() const [T = Chromosome]"
            ;
            goto LAB_00111d25;
          }
          dVar13 = Creature::get_phenotype(this_00,0,0,peVar2->ALLELE_SIZE);
          util::logging::Msg::operator+(&local_268,&local_238,dVar13);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"; fitness: ","");
          util::logging::Msg::operator+(&local_118,&local_268,&local_a8);
          if (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[val * 2] == 0.0) goto LAB_00111ce2;
          util::logging::Msg::operator+
                    (&local_148,&local_118,
                     *(double *)
                      ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[val * 2] + 0x30));
          (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_148);
          util::logging::Msg::~Msg(&local_148);
          util::logging::Msg::~Msg(&local_118);
          psVar3 = local_78;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          util::logging::Msg::~Msg(&local_268);
          util::logging::Msg::~Msg(&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          util::logging::Msg::~Msg(&local_208);
          util::logging::Msg::~Msg(&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          util::logging::Msg::~Msg(&local_1a8);
          util::logging::Msg::~Msg(&local_178);
          boost::detail::shared_count::~shared_count(&local_80);
          if ((Creature *)
              tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[val * 2] == (Creature *)0x0)
          goto LAB_00111ce2;
          Creature::set_elite((Creature *)
                              tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[val * 2],true);
          if (local_70->px == (element_type *)0x0) break;
          if (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[val * 2] == 0.0) {
            pcVar9 = 
            "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<Creature>::operator*() const [T = Creature]"
            ;
            goto LAB_00111d44;
          }
          (*local_70->px->_vptr_Population[2])();
          std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
          _M_erase((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                    *)&tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                   (shared_ptr<Creature> *)
                   (tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + val * 2));
          __src = (pointer)((long)local_68 + lVar11 + 8);
          if (__src != tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) {
            memmove((void *)((long)local_68 + lVar11),__src,
                    (long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)__src);
          }
          tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + -1;
          uVar12 = uVar12 + 1;
          peVar7 = psVar3->px;
        } while (peVar7 != (element_type *)0x0);
      }
    }
  }
  pcVar9 = 
  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Population>::operator->() const [T = Population]"
  ;
LAB_00111d25:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,pcVar9);
}

Assistant:

void World_3df::save_elite( shared_ptr<Population>& src, boost::shared_ptr<Population>& dst )
{
	Population::creatfitdict_t tmp(src->get_creatures_fdict());
	Population::creat_t tmps(src->get_creatures());

	(*get_log()) << "Zachowuję elity...";

	for(size_t i = 0; i < src->ELITE_SIZE; ++i)
	{
		Population::creatfitdict_t::iterator mxit = max_element(tmp.begin(), tmp.end());
		size_t dist = std::distance(tmp.begin(), mxit);

		(*get_log()) << util::logging::Msg("...Zachowano stwora z pozycji [") + static_cast<long long> (dist)
				+ "]: x1 = " + tmps[dist]->get_phenotype(0, 0, 0) + "; x2 = " + tmps[dist]->get_phenotype(0, 0,
				tmps[dist]->get_chroms()[0]->ALLELE_SIZE) + "; fitness: " + tmps[dist]-> get_fitness();

		tmps[dist]->set_elite(true);
		dst->add_creature(*tmps[dist]);

		tmps.erase(tmps.begin() + dist);
		tmp.erase(tmp.begin() + dist);
	}

	(*get_log()) << "Już";
}